

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O0

void dlib::impl2::read_thread
               (bsp_con *con,unsigned_long node_id,unsigned_long sender_id,
               thread_safe_message_queue *msg_buffer)

{
  vectorstream sout_1;
  msg_data msg_2;
  exception *e;
  vectorstream sout;
  msg_data msg_1;
  msg_data msg;
  msg_data *in_stack_fffffffffffffb30;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_fffffffffffffb40;
  istream *in_stack_fffffffffffffb88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  msg_data *in_stack_fffffffffffffb98;
  thread_safe_message_queue *in_stack_fffffffffffffba0;
  int local_58;
  char local_30;
  
  do {
    impl1::msg_data::msg_data(in_stack_fffffffffffffb30);
    deserialize((char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    if (local_30 == '\0') {
      operator_new(0x18);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x3c4da5);
      std::__shared_ptr<std::vector<char,std::allocator<char>>,(__gnu_cxx::_Lock_policy)2>::
      reset<std::vector<char,std::allocator<char>>>
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      deserialize((uint64 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffb30);
      deserialize<std::allocator<char>>(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    }
    impl1::thread_safe_message_queue::push_and_consume
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    if (local_30 == '\x05') {
      local_58 = 3;
    }
    else {
      local_58 = 0;
    }
    impl1::msg_data::~msg_data((msg_data *)0x3c54cb);
  } while (local_58 == 0);
  return;
}

Assistant:

void read_thread (
            impl1::bsp_con* con,
            unsigned long node_id,
            unsigned long sender_id,
            impl1::thread_safe_message_queue& msg_buffer
        )
        {
            try
            {
                while(true)
                {
                    impl1::msg_data msg;
                    deserialize(msg.msg_type, con->stream);
                    msg.sender_id = sender_id;

                    if (msg.msg_type == MESSAGE_HEADER)
                    {
                        msg.data.reset(new std::vector<char>);
                        deserialize(msg.epoch, con->stream);
                        deserialize(*msg.data, con->stream);
                    }

                    msg_buffer.push_and_consume(msg);

                    if (msg.msg_type == NODE_TERMINATE)
                        break;
                }
            }
            catch (std::exception& e)
            {
                impl1::msg_data msg;
                msg.data.reset(new std::vector<char>);
                vectorstream sout(*msg.data);
                sout << "An exception was thrown while attempting to receive a message from processing node " << sender_id << ".\n";
                sout << "  Sending processing node address:   " << con->con->get_foreign_ip() << ":" << con->con->get_foreign_port() << std::endl;
                sout << "  Receiving processing node address: " << con->con->get_local_ip() << ":" << con->con->get_local_port() << std::endl;
                sout << "  Receiving processing node id:      " << node_id << std::endl;
                sout << "  Error message in the exception:    " << e.what() << std::endl;

                msg.sender_id = sender_id;
                msg.msg_type = READ_ERROR;

                msg_buffer.push_and_consume(msg);
            }
            catch (...)
            {
                impl1::msg_data msg;
                msg.data.reset(new std::vector<char>);
                vectorstream sout(*msg.data);
                sout << "An exception was thrown while attempting to receive a message from processing node " << sender_id << ".\n";
                sout << "  Sending processing node address:   " << con->con->get_foreign_ip() << ":" << con->con->get_foreign_port() << std::endl;
                sout << "  Receiving processing node address: " << con->con->get_local_ip() << ":" << con->con->get_local_port() << std::endl;
                sout << "  Receiving processing node id:      " << node_id << std::endl;

                msg.sender_id = sender_id;
                msg.msg_type = READ_ERROR;

                msg_buffer.push_and_consume(msg);
            }
        }